

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

_Bool parse_skip_until(gravity_parser_t *parser,gtoken_t token)

{
  gravity_lexer_t *lexer_00;
  gtoken_t gVar1;
  gtoken_t tok;
  gravity_lexer_t *lexer;
  gtoken_t token_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  do {
    gVar1 = gravity_lexer_next(lexer_00);
    if (gVar1 == token) {
      return true;
    }
  } while (gVar1 != TOK_EOF);
  return false;
}

Assistant:

static bool parse_skip_until (gravity_parser_t *parser, gtoken_t token) {
    DECLARE_LEXER;

    while (1) {
        gtoken_t tok = gravity_lexer_next(lexer);
        if (tok == token) return true;
        if (tok == TOK_EOF) return false;
    }

    return false;
}